

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

buf_chunk * get_non_full_tail(bufq *q)

{
  _Bool _Var1;
  buf_chunk *chunk;
  bufq *q_local;
  
  if ((q->tail == (buf_chunk *)0x0) || (_Var1 = chunk_is_full(q->tail), _Var1)) {
    q_local = (bufq *)get_spare(q);
    if (q_local != (bufq *)0x0) {
      if (q->tail == (buf_chunk *)0x0) {
        q->tail = (buf_chunk *)q_local;
        q->head = (buf_chunk *)q_local;
      }
      else {
        q->tail->next = (buf_chunk *)q_local;
        q->tail = (buf_chunk *)q_local;
      }
    }
  }
  else {
    q_local = (bufq *)q->tail;
  }
  return (buf_chunk *)q_local;
}

Assistant:

static struct buf_chunk *get_non_full_tail(struct bufq *q)
{
  struct buf_chunk *chunk;

  if(q->tail && !chunk_is_full(q->tail))
    return q->tail;
  chunk = get_spare(q);
  if(chunk) {
    /* new tail, and possibly new head */
    if(q->tail) {
      q->tail->next = chunk;
      q->tail = chunk;
    }
    else {
      DEBUGASSERT(!q->head);
      q->head = q->tail = chunk;
    }
  }
  return chunk;
}